

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

Reader * __thiscall xLearn::Solver::create_reader(Solver *this)

{
  ObjectCreatorRegistry_xLearn_reader_registry *this_00;
  Reader *pRVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  allocator local_6e;
  allocator local_6d;
  Logger local_6c;
  string local_68;
  string local_48;
  string str;
  
  pcVar3 = "memory";
  if (((this->hyper_param_).on_disk & 1U) != 0) {
    pcVar3 = "disk";
  }
  pcVar4 = "dmatrix";
  if ((this->hyper_param_).from_file != false) {
    pcVar4 = pcVar3;
  }
  std::__cxx11::string::string((string *)&str,pcVar4,(allocator *)&local_68);
  this_00 = GetRegistry_xLearn_reader_registry();
  std::__cxx11::string::string((string *)&local_68,str._M_dataplus._M_p,(allocator *)&local_48);
  pRVar1 = ObjectCreatorRegistry_xLearn_reader_registry::CreateObject(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (pRVar1 == (Reader *)0x0) {
    local_6c.severity_ = FATAL;
    std::__cxx11::string::string
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,&local_6d);
    std::__cxx11::string::string((string *)&local_48,"create_reader",&local_6e);
    poVar2 = Logger::Start(FATAL,&local_68,0x4c,&local_48);
    poVar2 = std::operator<<(poVar2,"Cannot create reader: ");
    std::operator<<(poVar2,(string *)&str);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    Logger::~Logger(&local_6c);
  }
  std::__cxx11::string::~string((string *)&str);
  return pRVar1;
}

Assistant:

Reader* Solver::create_reader() {
  Reader* reader;
  std::string str = hyper_param_.from_file ? hyper_param_.on_disk ? "disk" : "memory" : "dmatrix";
  reader = CREATE_READER(str.c_str());
  if (reader == nullptr) {
    LOG(FATAL) << "Cannot create reader: " << str;
  }
  return reader;
}